

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

long ps_decode_raw(ps_decoder_t *ps,FILE *rawfh,long maxsamps)

{
  int iVar1;
  int16 *data_00;
  long __off;
  long lVar2;
  size_t n_samples;
  size_t n_samples_00;
  int16 data [256];
  
  ps_start_utt(ps);
  if (maxsamps == -1) {
    __off = ftell((FILE *)rawfh);
    if (__off < 0) {
      n_samples = 0;
      while( true ) {
        iVar1 = feof((FILE *)rawfh);
        if (iVar1 != 0) break;
        n_samples_00 = fread(data,2,0x100,(FILE *)rawfh);
        ps_process_raw(ps,data,n_samples_00,0,0);
        n_samples = n_samples + n_samples_00;
      }
      goto LAB_0010a5f8;
    }
    fseek((FILE *)rawfh,0,2);
    lVar2 = ftell((FILE *)rawfh);
    fseek((FILE *)rawfh,__off,0);
    maxsamps = lVar2 - __off;
    data_00 = (int16 *)__ckd_calloc__(maxsamps,2,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                      ,0x41c);
  }
  else {
    data_00 = (int16 *)__ckd_calloc__(maxsamps,2,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                      ,0x412);
  }
  n_samples = fread(data_00,2,maxsamps,(FILE *)rawfh);
  ps_process_raw(ps,data_00,n_samples,0,1);
  ckd_free(data_00);
LAB_0010a5f8:
  ps_end_utt(ps);
  return n_samples;
}

Assistant:

long
ps_decode_raw(ps_decoder_t *ps, FILE *rawfh,
              long maxsamps)
{
    int16 *data;
    long total, pos, endpos;

    ps_start_utt(ps);

    /* If this file is seekable or maxsamps is specified, then decode
     * the whole thing at once. */
    if (maxsamps != -1) {
        data = ckd_calloc(maxsamps, sizeof(*data));
        total = fread(data, sizeof(*data), maxsamps, rawfh);
        ps_process_raw(ps, data, total, FALSE, TRUE);
        ckd_free(data);
    } else if ((pos = ftell(rawfh)) >= 0) {
        fseek(rawfh, 0, SEEK_END);
        endpos = ftell(rawfh);
        fseek(rawfh, pos, SEEK_SET);
        maxsamps = endpos - pos;

        data = ckd_calloc(maxsamps, sizeof(*data));
        total = fread(data, sizeof(*data), maxsamps, rawfh);
        ps_process_raw(ps, data, total, FALSE, TRUE);
        ckd_free(data);
    } else {
        /* Otherwise decode it in a stream. */
        total = 0;
        while (!feof(rawfh)) {
            int16 data[256];
            size_t nread;

            nread = fread(data, sizeof(*data), sizeof(data)/sizeof(*data), rawfh);
            ps_process_raw(ps, data, nread, FALSE, FALSE);
            total += nread;
        }
    }
    ps_end_utt(ps);
    return total;
}